

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.cc
# Opt level: O0

void __thiscall CoreML::Specification::ModelDescription::SharedDtor(ModelDescription *this)

{
  string *psVar1;
  ModelDescription *pMVar2;
  ModelDescription *this_local;
  
  psVar1 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::DestroyNoArena(&this->predictedfeaturename_,psVar1);
  psVar1 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::DestroyNoArena
            (&this->predictedprobabilitiesname_,psVar1);
  pMVar2 = internal_default_instance();
  if ((this != pMVar2) && (this->metadata_ != (Metadata *)0x0)) {
    (*(this->metadata_->super_MessageLite)._vptr_MessageLite[1])();
  }
  return;
}

Assistant:

void ModelDescription::SharedDtor() {
  predictedfeaturename_.DestroyNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  predictedprobabilitiesname_.DestroyNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (this != internal_default_instance()) {
    delete metadata_;
  }
}